

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test::
OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test
          (OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test *this)

{
  OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test_00a10c50;
  return;
}

Assistant:

TEST(OverheadTest, Overhead_AlternatingSmallLargeBlocks) {
  OverheadTest test(512, 4096);
  for (int i = 0; i < 100; i++) {
    test.Alloc(5000);
    test.Alloc(64);
  }
  if (!UPB_ASAN) {
    EXPECT_NEAR(test.WastePct(), 0.007, 0.0025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.52, 0.025);
  }
}